

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::IFF_PDU::IFF_PDU(IFF_PDU *this)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__IFF_PDU_00320320;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EmittingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID);
  DATA_TYPE::Vector::Vector(&this->m_Location);
  DATA_TYPE::SystemIdentifier::SystemIdentifier(&this->m_SystemID);
  this->m_ui8SystemDesignator = '\0';
  this->m_ui8SystemSpecific = '\0';
  DATA_TYPE::FundamentalOperationalData::FundamentalOperationalData(&this->m_FOD);
  (this->m_vLayers).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vLayers).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vLayers).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = '\x1c';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x06';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x3c;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\a';
  return;
}

Assistant:

IFF_PDU::IFF_PDU() :
    m_ui8SystemDesignator( 0 ),
	m_ui8SystemSpecific( 0 )
{
    m_ui8ProtocolFamily = Distributed_Emission_Regeneration;
    m_ui8PDUType = IFF_ATC_NAVAIDS_PDU_Type;
    m_ui16PDULength = IFF_PDU_SIZE;

	#if DIS_VERSION > 6
	m_ui8ProtocolVersion = IEEE_1278_1_2012;
	#else 
	m_ui8ProtocolVersion = IEEE_1278_1A_1998;
	#endif
}